

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void cume_distValueFunc(sqlite3_context *pCtx)

{
  char *pcVar1;
  
  if ((short)pCtx->pMem->flags < 0) {
    pcVar1 = pCtx->pMem->z;
  }
  else {
    pcVar1 = (char *)createAggContext(pCtx,0);
  }
  if (pcVar1 != (char *)0x0) {
    sqlite3VdbeMemSetDouble
              (pCtx->pOut,(double)*(long *)(pcVar1 + 8) / (double)*(long *)(pcVar1 + 0x10));
    return;
  }
  return;
}

Assistant:

static void cume_distValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, 0);
  if( p ){
    double r = (double)(p->nStep) / (double)(p->nTotal);
    sqlite3_result_double(pCtx, r);
  }
}